

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.h
# Opt level: O0

string * __thiscall CLI::Formatter::make_description_abi_cxx11_(Formatter *this,App *app)

{
  undefined1 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar2;
  App *in_RDX;
  string *in_RDI;
  size_t max_options;
  size_t min_options;
  string desc;
  App *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string local_38 [32];
  App *local_18;
  
  local_18 = in_RDX;
  App::get_description_abi_cxx11_(in_stack_fffffffffffffd98);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          App::get_require_option_min(local_18);
  local_40 = __rhs;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          App::get_require_option_max(local_18);
  local_58 = __lhs;
  uVar1 = App::get_required(local_18);
  if ((bool)uVar1) {
    ::std::__cxx11::string::operator+=(local_38," REQUIRED ");
  }
  if ((local_58 == local_40) &&
     (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1) {
      ::std::__cxx11::string::operator+=
                (local_38," \n[Exactly 1 of the following options is required]");
    }
    else {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffdd8);
      ::std::operator+((char *)__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar1,in_stack_fffffffffffffda0));
      ::std::operator+(__lhs,(char *)CONCAT17(uVar1,in_stack_fffffffffffffda0));
      ::std::__cxx11::string::operator+=(local_38,local_78);
      ::std::__cxx11::string::~string(local_78);
      ::std::__cxx11::string::~string(local_98);
      ::std::__cxx11::string::~string(local_b8);
    }
  }
  else if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffdd8);
      ::std::operator+((char *)__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar1,in_stack_fffffffffffffda0));
      ::std::operator+(__lhs,(char *)CONCAT17(uVar1,in_stack_fffffffffffffda0));
      ::std::__cxx11::string::operator+=(local_38,local_1f8);
      ::std::__cxx11::string::~string(local_1f8);
      ::std::__cxx11::string::~string(local_218);
      ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc8);
    }
  }
  else if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffdd8);
    ::std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,in_stack_fffffffffffffda0));
    ::std::operator+(__lhs,(char *)CONCAT17(uVar1,in_stack_fffffffffffffda0));
    ::std::__cxx11::string::operator+=(local_38,local_198);
    ::std::__cxx11::string::~string(local_198);
    ::std::__cxx11::string::~string(local_1b8);
    ::std::__cxx11::string::~string(local_1d8);
  }
  else {
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffdd8);
    ::std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,in_stack_fffffffffffffda0));
    ::std::operator+(__lhs,(char *)CONCAT17(uVar1,in_stack_fffffffffffffda0));
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffdd8);
    ::std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    ::std::operator+(__lhs,(char *)CONCAT17(uVar1,in_stack_fffffffffffffda0));
    ::std::__cxx11::string::operator+=(local_38,local_d8);
    ::std::__cxx11::string::~string(local_d8);
    ::std::__cxx11::string::~string(local_f8);
    ::std::__cxx11::string::~string(local_178);
    ::std::__cxx11::string::~string(local_118);
    ::std::__cxx11::string::~string(local_138);
    ::std::__cxx11::string::~string(local_158);
  }
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::operator+(in_stack_fffffffffffffdc8,(char *)__rhs);
  }
  else {
    ::std::__cxx11::string::string((string *)in_RDI);
  }
  ::std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

inline std::string Formatter::make_description(const App *app) const {
    std::string desc = app->get_description();
    auto min_options = app->get_require_option_min();
    auto max_options = app->get_require_option_max();
    if(app->get_required()) {
        desc += " REQUIRED ";
    }
    if((max_options == min_options) && (min_options > 0)) {
        if(min_options == 1) {
            desc += " \n[Exactly 1 of the following options is required]";
        } else {
            desc += " \n[Exactly " + std::to_string(min_options) + "options from the following list are required]";
        }
    } else if(max_options > 0) {
        if(min_options > 0) {
            desc += " \n[Between " + std::to_string(min_options) + " and " + std::to_string(max_options) +
                    " of the follow options are required]";
        } else {
            desc += " \n[At most " + std::to_string(max_options) + " of the following options are allowed]";
        }
    } else if(min_options > 0) {
        desc += " \n[At least " + std::to_string(min_options) + " of the following options are required]";
    }
    return (!desc.empty()) ? desc + "\n" : std::string{};
}